

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_str.c
# Opt level: O1

int adt_str_charAt(adt_str_t *self,int index)

{
  int iVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  
  if (self != (adt_str_t *)0x0) {
    if (index < 0) {
      iVar4 = -index;
      iVar1 = self->s32Cur;
      if (SBORROW4(iVar1,iVar4) == iVar1 + index < 0) {
        iVar4 = iVar1 + index;
        bVar2 = true;
        cVar3 = '\0';
      }
      else {
        cVar3 = '\x03';
        bVar2 = false;
      }
    }
    else {
      bVar2 = index < self->s32Cur;
      cVar3 = (self->s32Cur <= index) * '\x03';
      iVar4 = index;
    }
    if (bVar2) {
      return (int)self->pAlloc[iVar4];
    }
    self->lastError = cVar3;
  }
  return -1;
}

Assistant:

int adt_str_charAt(adt_str_t *self, int index)
{
   int retval = -1;
   adt_error_t errorCode = ADT_NO_ERROR;
   if(self != 0)
   {
      int32_t s32Index;
      if(index < 0)
      {
         s32Index=(int32_t) (-index);
         if(s32Index <= self->s32Cur)
         {
            s32Index = self->s32Cur-s32Index;
         }
         else
         {
            errorCode = ADT_INDEX_OUT_OF_BOUNDS_ERROR;
         }
      }
      else
      {
         s32Index = (int32_t) index;
         if(s32Index >= self->s32Cur)
         {
            errorCode = ADT_INDEX_OUT_OF_BOUNDS_ERROR;
         }
      }
      if (errorCode == ADT_NO_ERROR)
      {
         retval = (int) self->pAlloc[s32Index];
      }
      else
      {
         self->lastError = errorCode;
      }
   }
   return retval;

}